

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::is_immutable(Compiler *this,uint32_t id)

{
  bool bVar1;
  Types TVar2;
  Variant *pVVar3;
  SPIRVariable *pSVar4;
  SPIRAccessChain *pSVar5;
  SPIRExpression *pSVar6;
  byte local_39;
  bool pointer_to_const;
  SPIRVariable *var;
  uint32_t id_local;
  Compiler *this_local;
  
  pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
  TVar2 = Variant::get_type(pVVar3);
  if (TVar2 == TypeVariable) {
    pSVar4 = get<spirv_cross::SPIRVariable>(this,id);
    local_39 = 1;
    if ((pSVar4->storage != StorageClassUniformConstant) &&
       (local_39 = 1, (pSVar4->phi_variable & 1U) == 0)) {
      bVar1 = expression_is_lvalue(this,id);
      local_39 = bVar1 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else {
    pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                       (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
    TVar2 = Variant::get_type(pVVar3);
    if (TVar2 == TypeAccessChain) {
      pSVar5 = get<spirv_cross::SPIRAccessChain>(this,id);
      this_local._7_1_ = (bool)(pSVar5->immutable & 1);
    }
    else {
      pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
      TVar2 = Variant::get_type(pVVar3);
      if (TVar2 == TypeExpression) {
        pSVar6 = get<spirv_cross::SPIRExpression>(this,id);
        this_local._7_1_ = (bool)(pSVar6->immutable & 1);
      }
      else {
        pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
        TVar2 = Variant::get_type(pVVar3);
        if (TVar2 != TypeConstant) {
          pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                             (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
          TVar2 = Variant::get_type(pVVar3);
          if (TVar2 != TypeConstantOp) {
            pVVar3 = VectorView<spirv_cross::Variant>::operator[]
                               (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
            TVar2 = Variant::get_type(pVVar3);
            if (TVar2 != TypeUndef) {
              return false;
            }
          }
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::is_immutable(uint32_t id) const
{
	if (ir.ids[id].get_type() == TypeVariable)
	{
		auto &var = get<SPIRVariable>(id);

		// Anything we load from the UniformConstant address space is guaranteed to be immutable.
		bool pointer_to_const = var.storage == StorageClassUniformConstant;
		return pointer_to_const || var.phi_variable || !expression_is_lvalue(id);
	}
	else if (ir.ids[id].get_type() == TypeAccessChain)
		return get<SPIRAccessChain>(id).immutable;
	else if (ir.ids[id].get_type() == TypeExpression)
		return get<SPIRExpression>(id).immutable;
	else if (ir.ids[id].get_type() == TypeConstant || ir.ids[id].get_type() == TypeConstantOp ||
	         ir.ids[id].get_type() == TypeUndef)
		return true;
	else
		return false;
}